

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_cb.cpp
# Opt level: O0

void ucnv_cbToUWriteSub_63(UConverterToUnicodeArgs *args,int32_t offsetIndex,UErrorCode *err)

{
  UErrorCode *err_local;
  int32_t offsetIndex_local;
  UConverterToUnicodeArgs *args_local;
  
  if ((args->converter->invalidCharLength == '\x01') && (args->converter->subChar1 != '\0')) {
    ucnv_cbToUWriteUChars_63(args,&ucnv_cbToUWriteSub_63::kSubstituteChar1,1,offsetIndex,err);
  }
  else {
    ucnv_cbToUWriteUChars_63(args,&ucnv_cbToUWriteSub_63::kSubstituteChar,1,offsetIndex,err);
  }
  return;
}

Assistant:

U_CAPI void  U_EXPORT2
ucnv_cbToUWriteSub (UConverterToUnicodeArgs *args,
                         int32_t offsetIndex,
                       UErrorCode * err)
{
    static const UChar kSubstituteChar1 = 0x1A, kSubstituteChar = 0xFFFD;

    /* could optimize this case, just one uchar */
    if(args->converter->invalidCharLength == 1 && args->converter->subChar1 != 0) {
        ucnv_cbToUWriteUChars(args, &kSubstituteChar1, 1, offsetIndex, err);
    } else {
        ucnv_cbToUWriteUChars(args, &kSubstituteChar, 1, offsetIndex, err);
    }
}